

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int State_insert(state *data,config *key)

{
  config **ppcVar1;
  uint uVar2;
  s_x3node *psVar3;
  s_x3node **ppsVar4;
  size_t __nmemb;
  s_x3 *psVar5;
  int iVar6;
  int iVar7;
  config *pcVar8;
  s_x3node *psVar9;
  ulong uVar10;
  uint uVar11;
  symbol *psVar12;
  uint uVar13;
  config *pcVar14;
  symbol *psVar15;
  s_x3node *psVar16;
  
  psVar5 = x3a;
  if (x3a == (s_x3 *)0x0) {
LAB_00103a1c:
    iVar7 = 0;
  }
  else {
    uVar11 = 0;
    pcVar8 = key;
    if (key != (config *)0x0) {
      do {
        uVar11 = pcVar8->rp->index * 0x25 + uVar11 * 0x23b + pcVar8->dot;
        ppcVar1 = &pcVar8->bp;
        pcVar8 = *ppcVar1;
      } while (*ppcVar1 != (config *)0x0);
    }
    iVar7 = x3a->size;
    for (psVar9 = x3a->ht[iVar7 - 1U & uVar11]; psVar9 != (s_x3node *)0x0; psVar9 = psVar9->next) {
      iVar6 = statecmp(psVar9->key,key);
      if (iVar6 == 0) goto LAB_00103a1c;
    }
    uVar2 = psVar5->count;
    if (iVar7 <= (int)uVar2) {
      __nmemb = (long)iVar7 * 2;
      psVar9 = (s_x3node *)calloc(__nmemb,0x28);
      if (psVar9 == (s_x3node *)0x0) goto LAB_00103a1c;
      psVar16 = psVar9 + (long)iVar7 * 2;
      iVar6 = (int)__nmemb;
      if (0 < iVar7) {
        uVar10 = 1;
        if (1 < iVar6) {
          uVar10 = __nmemb & 0xffffffff;
        }
        memset(psVar16,0,uVar10 << 3);
      }
      if (0 < (int)uVar2) {
        uVar10 = 0;
        do {
          psVar3 = psVar5->tbl;
          pcVar8 = psVar3[uVar10].key;
          uVar13 = 0;
          if (pcVar8 != (config *)0x0) {
            uVar13 = 0;
            pcVar14 = pcVar8;
            do {
              uVar13 = pcVar14->rp->index * 0x25 + uVar13 * 0x23b + pcVar14->dot;
              pcVar14 = pcVar14->bp;
            } while (pcVar14 != (config *)0x0);
          }
          uVar13 = uVar13 & iVar6 - 1U;
          psVar15 = (symbol *)(psVar9 + uVar10);
          if ((&psVar16->data)[uVar13] != (state *)0x0) {
            (&psVar16->data)[uVar13]->ap = (action *)&psVar15->rule;
          }
          psVar12 = (symbol *)(&psVar16->data + uVar13);
          psVar15->rule = (rule *)psVar12->name;
          *(config **)&psVar15->index = pcVar8;
          psVar15->name = (char *)psVar3[uVar10].data;
          psVar15->fallback = psVar12;
          psVar12->name = (char *)psVar15;
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar2);
      }
      free(psVar5->tbl);
      psVar5->size = iVar6;
      psVar5->count = uVar2;
      psVar5->tbl = psVar9;
      psVar5->ht = (s_x3node **)psVar16;
    }
    uVar11 = psVar5->size - 1U & uVar11;
    psVar16 = psVar5->tbl;
    iVar7 = psVar5->count;
    psVar5->count = iVar7 + 1;
    psVar9 = psVar16 + iVar7;
    psVar16[iVar7].key = key;
    psVar16[iVar7].data = data;
    ppsVar4 = psVar5->ht;
    if (ppsVar4[uVar11] != (s_x3node *)0x0) {
      ppsVar4[uVar11]->from = &psVar9->next;
    }
    psVar9->next = ppsVar4[uVar11];
    ppsVar4[uVar11] = psVar9;
    psVar9->from = psVar5->ht + uVar11;
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int State_insert(struct state *data, struct config *key)
{
  x3node *np;
  unsigned h;
  unsigned ph;

  if( x3a==0 ) return 0;
  ph = statehash(key);
  h = ph & (x3a->size-1);
  np = x3a->ht[h];
  while( np ){
    if( statecmp(np->key,key)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x3a->count>=x3a->size ){
    /* Need to make the hash table bigger */
    int i,arrSize;
    struct s_x3 array;
    array.size = arrSize = x3a->size*2;
    array.count = x3a->count;
    array.tbl = (x3node*)calloc(arrSize, sizeof(x3node) + sizeof(x3node*));
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x3node**)&(array.tbl[arrSize]);
    for(i=0; i<arrSize; i++) array.ht[i] = 0;
    for(i=0; i<x3a->count; i++){
      x3node *oldnp, *newnp;
      oldnp = &(x3a->tbl[i]);
      h = statehash(oldnp->key) & (arrSize-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->key = oldnp->key;
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x3a->tbl);
    *x3a = array;
  }
  /* Insert the new data */
  h = ph & (x3a->size-1);
  np = &(x3a->tbl[x3a->count++]);
  np->key = key;
  np->data = data;
  if( x3a->ht[h] ) x3a->ht[h]->from = &(np->next);
  np->next = x3a->ht[h];
  x3a->ht[h] = np;
  np->from = &(x3a->ht[h]);
  return 1;
}